

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta,double obj_amp)

{
  int bkmin;
  row_iterator prVar1;
  default_cost_type<double> *this_00;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> prVar2;
  double dVar3;
  bool bVar4;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> *pprVar5;
  __tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_> *pprVar6;
  type prVar7;
  pointer begin;
  pointer prVar8;
  type pbVar9;
  type args_1;
  type prVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool local_129;
  undefined1 auStack_c8 [7];
  bool pi_change;
  string_view local_b8;
  int local_a4;
  undefined1 auStack_a0 [4];
  int i_1;
  int local_90;
  int local_8c;
  int selected;
  int i;
  rc_size sizes;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_64;
  undefined1 auStack_60 [4];
  int k;
  bool local_49;
  double dStack_48;
  bool at_least_one_pi_changed;
  double obj_amp_local;
  double theta_local;
  double delta_local;
  double kappa_local;
  bit_array *x_local;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  *this_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  local_49 = false;
  dStack_48 = obj_amp;
  obj_amp_local = theta;
  theta_local = delta;
  delta_local = kappa;
  kappa_local = (double)x;
  x_local = (bit_array *)this;
  this_local = (solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                *)last._M_current;
  last_local = first;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,
             "push-update-row {} {} {}\n");
  debug_logger<true>::log<double,double,double>
            ((debug_logger<true> *)this,_auStack_60,&delta_local,&theta_local,&obj_amp_local);
  while( true ) {
    bVar4 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                      (&last_local,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &this_local);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      return (bool)(local_49 & 1);
    }
    local_64 = constraint<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                         (last_local);
    if (*(int *)(this + 0x88) <= local_64) break;
    sparse_matrix<int>::row((sparse_matrix<int> *)&sizes,(int)this + 0x10);
    pprVar5 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    prVar1 = *pprVar5;
    pprVar6 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
    ::decrease_preference
              ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                *)this,prVar1,*pprVar6,obj_amp_local);
    pprVar5 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    prVar1 = *pprVar5;
    pprVar6 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    _selected = solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                ::compute_reduced_costs<baryonyx::bit_array>
                          ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                            *)this,prVar1,*pprVar6,(bit_array *)kappa_local);
    for (local_8c = 0; dVar3 = dStack_48, local_8c != selected; local_8c = local_8c + 1) {
      this_00 = *(default_cost_type<double> **)(this + 0x80);
      pprVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                            *)&sizes);
      prVar2 = *pprVar5;
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x68),(long)local_8c);
      auVar11._0_8_ =
           default_cost_type<double>::operator()
                     (this_00,prVar2[prVar7->id].column,(bit_array *)kappa_local);
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x68),(long)local_8c);
      auVar11._8_8_ = 0;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar3;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = prVar7->value;
      auVar11 = vfmadd213sd_fma(auVar11,auVar12,auVar13);
      prVar7->value = auVar11._0_8_;
    }
    begin = std::
            unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
            ::get((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                   *)(this + 0x68));
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
             ::get((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                    *)(this + 0x68));
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>
              (begin,prVar8 + selected,*(random_engine **)(this + 8));
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_64);
    bkmin = pbVar9->min;
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_64);
    local_90 = solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
               ::select_variables((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                                   *)this,(rc_size *)&selected,bkmin,pbVar9->max);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_a0,
               "constraints {}: {} <= ");
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_64);
    debug_logger<true>::log<int,int>((debug_logger<true> *)this,_auStack_a0,&local_64,&pbVar9->min);
    for (local_a4 = 0; local_a4 < selected; local_a4 = local_a4 + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_b8,"{} ({} {}) ");
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x68),(long)local_a4);
      args_1 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x68),(long)local_a4);
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                              *)(this + 0x68),(long)local_a4);
      debug_logger<true>::log<int,double,int>
                ((debug_logger<true> *)this,local_b8,&prVar7->f,&args_1->value,&prVar10->id);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8,
               "<= {} => Selected: {}\n");
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_64);
    debug_logger<true>::log<int,int>((debug_logger<true> *)this,_auStack_c8,&pbVar9->max,&local_90);
    dVar3 = kappa_local;
    pprVar5 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    bVar4 = affect<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                      ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                        *)this,(bit_array *)dVar3,*pprVar5,local_64,local_90,selected,delta_local,
                       theta_local);
    local_129 = true;
    if ((local_49 & 1U) == 0) {
      local_129 = bVar4;
    }
    local_49 = local_129;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&last_local);
  }
  details::fail_fast("Precondition","k < m",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-101.cpp"
                     ,"266");
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }